

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O0

int buffers_alias(void *a,size_t a_bytes,void *b,size_t b_bytes)

{
  bool local_39;
  uintptr_t b_u;
  uintptr_t a_u;
  size_t b_bytes_local;
  void *b_local;
  size_t a_bytes_local;
  void *a_local;
  
  local_39 = b < (void *)((long)a + a_bytes) && a < (void *)((long)b + b_bytes);
  return (int)local_39;
}

Assistant:

static inline int buffers_alias(const void *a, size_t a_bytes, const void *b,
                                size_t b_bytes) {
  // Cast |a| and |b| to integers. In C, pointer comparisons between unrelated
  // objects are undefined whereas pointer to integer conversions are merely
  // implementation-defined. We assume the implementation defined it in a sane
  // way.
  uintptr_t a_u = (uintptr_t)a;
  uintptr_t b_u = (uintptr_t)b;
  return a_u + a_bytes > b_u && b_u + b_bytes > a_u;
}